

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O1

void Test_TemplateModifiers_AddXssSafeModifier::Run(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  char cVar5;
  bool bVar6;
  undefined8 extraout_RAX;
  string sStack_b0;
  string sStack_90;
  string sStack_70;
  string sStack_50;
  
  cVar5 = ctemplate::AddXssSafeModifier("x-asafetest",(TemplateModifier *)&ctemplate::html_escape);
  if (cVar5 == '\0') {
    Run();
LAB_0011501c:
    Run();
LAB_00115021:
    Run();
LAB_00115026:
    Run();
LAB_0011502b:
    Run();
LAB_00115030:
    Run();
LAB_00115035:
    Run();
LAB_0011503a:
    Run();
LAB_0011503f:
    Run();
LAB_00115044:
    Run();
LAB_00115049:
    Run();
LAB_0011504e:
    Run();
LAB_00115053:
    Run();
LAB_00115058:
    Run();
LAB_0011505d:
    Run();
  }
  else {
    cVar5 = ctemplate::AddXssSafeModifier
                      ("x-asafetest-arg=",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar5 == '\0') goto LAB_0011501c;
    cVar5 = ctemplate::AddXssSafeModifier
                      ("x-asafetest-arg=h",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar5 == '\0') goto LAB_00115021;
    cVar5 = ctemplate::AddXssSafeModifier("test",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar5 != '\0') goto LAB_00115026;
    cVar5 = ctemplate::AddXssSafeModifier("x-asafetest",(TemplateModifier *)&ctemplate::html_escape)
    ;
    if (cVar5 != '\0') goto LAB_0011502b;
    cVar5 = ctemplate::AddXssSafeModifier
                      ("x-asafetest-arg=",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar5 != '\0') goto LAB_00115030;
    cVar5 = ctemplate::AddXssSafeModifier
                      ("x-asafetest-arg=h",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar5 != '\0') goto LAB_00115035;
    cVar5 = ctemplate::AddModifier("x-safetest2",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar5 == '\0') goto LAB_0011503a;
    cVar5 = ctemplate::AddModifier("x-safetest2-arg=",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar5 == '\0') goto LAB_0011503f;
    cVar5 = ctemplate::AddModifier("x-safetest2-arg=h",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar5 == '\0') goto LAB_00115044;
    cVar5 = ctemplate::AddXssSafeModifier("x-safetest2",(TemplateModifier *)&ctemplate::html_escape)
    ;
    if (cVar5 != '\0') goto LAB_00115049;
    cVar5 = ctemplate::AddXssSafeModifier
                      ("x-safetest2-arg=",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar5 != '\0') goto LAB_0011504e;
    cVar5 = ctemplate::AddXssSafeModifier
                      ("x-safetest2-arg=h",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar5 != '\0') goto LAB_00115053;
    cVar5 = ctemplate::AddModifier("x-asafetest",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar5 != '\0') goto LAB_00115058;
    cVar5 = ctemplate::AddModifier("x-asafetest-arg=",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar5 != '\0') goto LAB_0011505d;
    cVar5 = ctemplate::AddModifier("x-asafetest-arg=h",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar5 == '\0') {
      return;
    }
  }
  Run();
  paVar1 = &sStack_50.field_2;
  sStack_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"h","");
  paVar2 = &sStack_70.field_2;
  sStack_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_70,"");
  paVar3 = &sStack_90.field_2;
  sStack_90._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_90,"h","");
  paVar4 = &sStack_b0.field_2;
  sStack_b0._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b0,"");
  bVar6 = CheckXSSAlternative(&sStack_50,&sStack_70,&sStack_90,&sStack_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_b0._M_dataplus._M_p != paVar4) {
    operator_delete(sStack_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_90._M_dataplus._M_p != paVar3) {
    operator_delete(sStack_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_70._M_dataplus._M_p != paVar2) {
    operator_delete(sStack_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_50._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_50._M_dataplus._M_p);
  }
  if (bVar6) {
    sStack_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"url_escape_with_arg","");
    sStack_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_70,"=javascript","");
    sStack_90._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_90,"url_escape_with_arg","");
    sStack_b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b0,"=javascript","");
    bVar6 = CheckXSSAlternative(&sStack_50,&sStack_70,&sStack_90,&sStack_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != paVar4) {
      operator_delete(sStack_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_90._M_dataplus._M_p != paVar3) {
      operator_delete(sStack_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_70._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_50._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_50._M_dataplus._M_p);
    }
    if (!bVar6) goto LAB_0011681d;
    sStack_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"x-bla","");
    sStack_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_70,"");
    sStack_90._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_90,"x-bla","");
    sStack_b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b0,"");
    bVar6 = CheckXSSAlternative(&sStack_50,&sStack_70,&sStack_90,&sStack_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != paVar4) {
      operator_delete(sStack_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_90._M_dataplus._M_p != paVar3) {
      operator_delete(sStack_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_70._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_50._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_50._M_dataplus._M_p);
    }
    if (!bVar6) goto LAB_00116822;
    sStack_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"H","");
    sStack_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_70,"=pre","");
    sStack_90._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_90,"p","");
    sStack_b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b0,"");
    bVar6 = CheckXSSAlternative(&sStack_50,&sStack_70,&sStack_90,&sStack_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != paVar4) {
      operator_delete(sStack_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_90._M_dataplus._M_p != paVar3) {
      operator_delete(sStack_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_70._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_50._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_50._M_dataplus._M_p);
    }
    if (!bVar6) goto LAB_00116827;
    sStack_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"url_query_escape","");
    sStack_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_70,"");
    sStack_90._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_90,"url_escape_with_arg","");
    sStack_b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b0,"=query","");
    bVar6 = CheckXSSAlternative(&sStack_50,&sStack_70,&sStack_90,&sStack_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != paVar4) {
      operator_delete(sStack_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_90._M_dataplus._M_p != paVar3) {
      operator_delete(sStack_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_70._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_50._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_50._M_dataplus._M_p);
    }
    if (!bVar6) goto LAB_0011682c;
    sStack_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"h","");
    sStack_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_70,"");
    sStack_90._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_90,"H","");
    sStack_b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b0,"=pre","");
    bVar6 = CheckXSSAlternative(&sStack_50,&sStack_70,&sStack_90,&sStack_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != paVar4) {
      operator_delete(sStack_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_90._M_dataplus._M_p != paVar3) {
      operator_delete(sStack_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_70._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_50._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_50._M_dataplus._M_p);
    }
    if (!bVar6) goto LAB_00116831;
    sStack_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"h","");
    sStack_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_70,"");
    sStack_90._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_90,"H","");
    sStack_b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b0,"=snippet","");
    bVar6 = CheckXSSAlternative(&sStack_50,&sStack_70,&sStack_90,&sStack_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != paVar4) {
      operator_delete(sStack_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_90._M_dataplus._M_p != paVar3) {
      operator_delete(sStack_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_70._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_50._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_50._M_dataplus._M_p);
    }
    if (!bVar6) goto LAB_00116836;
    sStack_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"h","");
    sStack_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_70,"");
    sStack_90._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_90,"H","");
    sStack_b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b0,"=attribute","");
    bVar6 = CheckXSSAlternative(&sStack_50,&sStack_70,&sStack_90,&sStack_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != paVar4) {
      operator_delete(sStack_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_90._M_dataplus._M_p != paVar3) {
      operator_delete(sStack_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_70._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_50._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_50._M_dataplus._M_p);
    }
    if (!bVar6) goto LAB_0011683b;
    sStack_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"h","");
    sStack_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_70,"");
    sStack_90._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_90,"H","");
    sStack_b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b0,"=url","");
    bVar6 = CheckXSSAlternative(&sStack_50,&sStack_70,&sStack_90,&sStack_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != paVar4) {
      operator_delete(sStack_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_90._M_dataplus._M_p != paVar3) {
      operator_delete(sStack_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_70._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_50._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_50._M_dataplus._M_p);
    }
    if (!bVar6) goto LAB_00116840;
    sStack_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"h","");
    sStack_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_70,"");
    sStack_90._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_90,"p","");
    sStack_b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b0,"");
    bVar6 = CheckXSSAlternative(&sStack_50,&sStack_70,&sStack_90,&sStack_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != paVar4) {
      operator_delete(sStack_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_90._M_dataplus._M_p != paVar3) {
      operator_delete(sStack_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_70._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_50._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_50._M_dataplus._M_p);
    }
    if (!bVar6) goto LAB_00116845;
    sStack_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"h","");
    sStack_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_70,"");
    sStack_90._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_90,"u","");
    sStack_b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b0,"");
    bVar6 = CheckXSSAlternative(&sStack_50,&sStack_70,&sStack_90,&sStack_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != paVar4) {
      operator_delete(sStack_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_90._M_dataplus._M_p != paVar3) {
      operator_delete(sStack_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_70._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_50._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_50._M_dataplus._M_p);
    }
    if (!bVar6) goto LAB_0011684a;
    sStack_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"h","");
    sStack_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_70,"");
    sStack_90._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_90,"U","");
    sStack_b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b0,"=query","");
    bVar6 = CheckXSSAlternative(&sStack_50,&sStack_70,&sStack_90,&sStack_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != paVar4) {
      operator_delete(sStack_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_90._M_dataplus._M_p != paVar3) {
      operator_delete(sStack_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_70._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_50._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_50._M_dataplus._M_p);
    }
    if (!bVar6) goto LAB_0011684f;
    sStack_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"h","");
    sStack_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_70,"");
    sStack_90._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_90,"U","");
    sStack_b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b0,"=html","");
    bVar6 = CheckXSSAlternative(&sStack_50,&sStack_70,&sStack_90,&sStack_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != paVar4) {
      operator_delete(sStack_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_90._M_dataplus._M_p != paVar3) {
      operator_delete(sStack_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_70._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_50._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_50._M_dataplus._M_p);
    }
    if (!bVar6) goto LAB_00116854;
    sStack_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"h","");
    sStack_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_70,"");
    sStack_90._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_90,"I","");
    sStack_b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b0,"=html","");
    bVar6 = CheckXSSAlternative(&sStack_50,&sStack_70,&sStack_90,&sStack_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != paVar4) {
      operator_delete(sStack_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_90._M_dataplus._M_p != paVar3) {
      operator_delete(sStack_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_70._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_50._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_50._M_dataplus._M_p);
    }
    if (!bVar6) goto LAB_00116859;
    sStack_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"H","");
    sStack_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_70,"=attribute","");
    sStack_90._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_90,"h","");
    sStack_b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b0,"");
    bVar6 = CheckXSSAlternative(&sStack_50,&sStack_70,&sStack_90,&sStack_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != paVar4) {
      operator_delete(sStack_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_90._M_dataplus._M_p != paVar3) {
      operator_delete(sStack_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_70._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_50._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_50._M_dataplus._M_p);
    }
    if (bVar6) goto LAB_0011685e;
    sStack_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"I","");
    sStack_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_70,"=html","");
    sStack_90._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_90,"h","");
    sStack_b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b0,"");
    bVar6 = CheckXSSAlternative(&sStack_50,&sStack_70,&sStack_90,&sStack_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != paVar4) {
      operator_delete(sStack_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_90._M_dataplus._M_p != paVar3) {
      operator_delete(sStack_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_70._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_50._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_50._M_dataplus._M_p);
    }
    if (bVar6) goto LAB_00116863;
    sStack_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"h","");
    sStack_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_70,"");
    sStack_90._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_90,"json_escape","");
    sStack_b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b0,"");
    bVar6 = CheckXSSAlternative(&sStack_50,&sStack_70,&sStack_90,&sStack_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != paVar4) {
      operator_delete(sStack_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_90._M_dataplus._M_p != paVar3) {
      operator_delete(sStack_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_70._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_50._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_50._M_dataplus._M_p);
    }
    if (bVar6) goto LAB_00116868;
    sStack_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"H","");
    sStack_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_70,"=pre","");
    sStack_90._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_90,"H","");
    sStack_b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b0,"=snippet","");
    bVar6 = CheckXSSAlternative(&sStack_50,&sStack_70,&sStack_90,&sStack_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != paVar4) {
      operator_delete(sStack_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_90._M_dataplus._M_p != paVar3) {
      operator_delete(sStack_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_70._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_50._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_50._M_dataplus._M_p);
    }
    if (!bVar6) goto LAB_0011686d;
    sStack_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"H","");
    sStack_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_70,"=pre","");
    sStack_90._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_90,"H","");
    sStack_b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b0,"=attribute","");
    bVar6 = CheckXSSAlternative(&sStack_50,&sStack_70,&sStack_90,&sStack_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != paVar4) {
      operator_delete(sStack_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_90._M_dataplus._M_p != paVar3) {
      operator_delete(sStack_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_70._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_50._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_50._M_dataplus._M_p);
    }
    if (!bVar6) goto LAB_00116872;
    sStack_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"H","");
    sStack_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_70,"=attribute","");
    sStack_90._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_90,"H","");
    sStack_b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b0,"=pre","");
    bVar6 = CheckXSSAlternative(&sStack_50,&sStack_70,&sStack_90,&sStack_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != paVar4) {
      operator_delete(sStack_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_90._M_dataplus._M_p != paVar3) {
      operator_delete(sStack_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_70._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_50._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_50._M_dataplus._M_p);
    }
    if (bVar6) goto LAB_00116877;
    sStack_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"json_escape","");
    sStack_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_70,"");
    sStack_90._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_90,"javascript_escape","");
    sStack_b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b0,"");
    bVar6 = CheckXSSAlternative(&sStack_50,&sStack_70,&sStack_90,&sStack_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != paVar4) {
      operator_delete(sStack_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_90._M_dataplus._M_p != paVar3) {
      operator_delete(sStack_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_70._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_50._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_50._M_dataplus._M_p);
    }
    if (!bVar6) goto LAB_0011687c;
    sStack_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"javascript_escape","");
    sStack_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_70,"");
    sStack_90._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_90,"json_escape","");
    sStack_b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b0,"");
    bVar6 = CheckXSSAlternative(&sStack_50,&sStack_70,&sStack_90,&sStack_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != paVar4) {
      operator_delete(sStack_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_90._M_dataplus._M_p != paVar3) {
      operator_delete(sStack_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_70._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_50._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_50._M_dataplus._M_p);
    }
    if (!bVar6) goto LAB_00116881;
    sStack_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"javascript_escape","");
    sStack_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_70,"");
    sStack_90._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_90,"I","");
    sStack_b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b0,"=javascript","");
    bVar6 = CheckXSSAlternative(&sStack_50,&sStack_70,&sStack_90,&sStack_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != paVar4) {
      operator_delete(sStack_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_90._M_dataplus._M_p != paVar3) {
      operator_delete(sStack_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_70._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_50._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_50._M_dataplus._M_p);
    }
    if (!bVar6) goto LAB_00116886;
    sStack_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"U","");
    sStack_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_70,"=javascript","");
    sStack_90._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_90,"I","");
    sStack_b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b0,"=javascript","");
    bVar6 = CheckXSSAlternative(&sStack_50,&sStack_70,&sStack_90,&sStack_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != paVar4) {
      operator_delete(sStack_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_90._M_dataplus._M_p != paVar3) {
      operator_delete(sStack_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_70._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_50._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_50._M_dataplus._M_p);
    }
    if (!bVar6) goto LAB_0011688b;
    sStack_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"I","");
    sStack_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_70,"=javascript","");
    sStack_90._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_90,"javascript_escape","");
    sStack_b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b0,"");
    bVar6 = CheckXSSAlternative(&sStack_50,&sStack_70,&sStack_90,&sStack_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != paVar4) {
      operator_delete(sStack_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_90._M_dataplus._M_p != paVar3) {
      operator_delete(sStack_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_70._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_50._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_50._M_dataplus._M_p);
    }
    if (bVar6) goto LAB_00116890;
    sStack_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"I","");
    sStack_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_70,"=javascript","");
    sStack_90._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_90,"U","");
    sStack_b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b0,"=javascript","");
    bVar6 = CheckXSSAlternative(&sStack_50,&sStack_70,&sStack_90,&sStack_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != paVar4) {
      operator_delete(sStack_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_90._M_dataplus._M_p != paVar3) {
      operator_delete(sStack_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_70._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_50._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_50._M_dataplus._M_p);
    }
    if (bVar6) goto LAB_00116895;
    sStack_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"c","");
    sStack_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_70,"");
    sStack_90._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_90,"U","");
    sStack_b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b0,"=css","");
    bVar6 = CheckXSSAlternative(&sStack_50,&sStack_70,&sStack_90,&sStack_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != paVar4) {
      operator_delete(sStack_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_90._M_dataplus._M_p != paVar3) {
      operator_delete(sStack_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_70._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_50._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_50._M_dataplus._M_p);
    }
    if (!bVar6) goto LAB_0011689a;
    sStack_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"c","");
    sStack_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_70,"");
    sStack_90._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_90,"I","");
    sStack_b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b0,"=css","");
    bVar6 = CheckXSSAlternative(&sStack_50,&sStack_70,&sStack_90,&sStack_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != paVar4) {
      operator_delete(sStack_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_90._M_dataplus._M_p != paVar3) {
      operator_delete(sStack_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_70._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_50._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_50._M_dataplus._M_p);
    }
    if (!bVar6) goto LAB_0011689f;
    sStack_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"U","");
    sStack_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_70,"=css","");
    sStack_90._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_90,"c","");
    sStack_b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b0,"");
    bVar6 = CheckXSSAlternative(&sStack_50,&sStack_70,&sStack_90,&sStack_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != paVar4) {
      operator_delete(sStack_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_90._M_dataplus._M_p != paVar3) {
      operator_delete(sStack_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_70._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_50._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_50._M_dataplus._M_p);
    }
    if (bVar6) goto LAB_001168a4;
    sStack_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"I","");
    sStack_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_70,"=css","");
    sStack_90._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_90,"c","");
    sStack_b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b0,"");
    bVar6 = CheckXSSAlternative(&sStack_50,&sStack_70,&sStack_90,&sStack_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != paVar4) {
      operator_delete(sStack_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_90._M_dataplus._M_p != paVar3) {
      operator_delete(sStack_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_70._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_50._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_50._M_dataplus._M_p);
    }
    if (!bVar6) {
      sStack_50._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"x-bla","");
      sStack_70._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_70,"");
      sStack_90._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_90,"x-foo","");
      sStack_b0._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b0,"");
      bVar6 = CheckXSSAlternative(&sStack_50,&sStack_70,&sStack_90,&sStack_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_b0._M_dataplus._M_p != paVar4) {
        operator_delete(sStack_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_90._M_dataplus._M_p != paVar3) {
        operator_delete(sStack_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_70._M_dataplus._M_p != paVar2) {
        operator_delete(sStack_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_50._M_dataplus._M_p != paVar1) {
        operator_delete(sStack_50._M_dataplus._M_p);
      }
      if (!bVar6) {
        return;
      }
      goto LAB_001168ae;
    }
  }
  else {
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_0011681d:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116822:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116827:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_0011682c:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116831:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116836:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_0011683b:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116840:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116845:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_0011684a:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_0011684f:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116854:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116859:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_0011685e:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116863:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116868:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_0011686d:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116872:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116877:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_0011687c:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116881:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116886:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_0011688b:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116890:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_00116895:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_0011689a:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_0011689f:
    Test_TemplateModifiers_XSSAlternatives::Run();
LAB_001168a4:
    Test_TemplateModifiers_XSSAlternatives::Run();
  }
  Test_TemplateModifiers_XSSAlternatives::Run();
LAB_001168ae:
  Test_TemplateModifiers_XSSAlternatives::Run();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_b0._M_dataplus._M_p != paVar4) {
    operator_delete(sStack_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_90._M_dataplus._M_p != paVar3) {
    operator_delete(sStack_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_70._M_dataplus._M_p != paVar2) {
    operator_delete(sStack_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_50._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_50._M_dataplus._M_p);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(TemplateModifiers, AddXssSafeModifier) {
  // For shorter lines.
  const GOOGLE_NAMESPACE::TemplateModifier* esc_fn =
      &GOOGLE_NAMESPACE::html_escape;

  EXPECT_TRUE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-asafetest", esc_fn));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-asafetest-arg=", esc_fn));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-asafetest-arg=h", esc_fn));

  // Make sure AddXssSafeModifier fails with an invalid name.
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddXssSafeModifier("test", esc_fn));

  // Make sure AddXssSafeModifier fails with a duplicate name.
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-asafetest", esc_fn));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-asafetest-arg=", esc_fn));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-asafetest-arg=h",
                                             esc_fn));

  // Make sure AddXssSafeModifier fails if the same modifier was
  // previously added via AddModifier.
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-safetest2", esc_fn));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-safetest2-arg=", esc_fn));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-safetest2-arg=h", esc_fn));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-safetest2", esc_fn));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-safetest2-arg=", esc_fn));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-safetest2-arg=h", esc_fn));

  // and vice versa.
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("x-asafetest", esc_fn));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("x-asafetest-arg=", esc_fn));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("x-asafetest-arg=h", esc_fn));
}